

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::ReadDataFromVarcharSegment
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  InternalException *this;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t len;
  long lVar3;
  ListSegment *pLVar4;
  char *pcVar5;
  ulong uVar6;
  ulong __n;
  ulong uVar7;
  Vector *pVVar8;
  anon_struct_16_3_d7536bce_for_pointer aVar9;
  allocator local_a1;
  ListSegment *local_a0;
  ListSegment *local_98;
  idx_t *local_90;
  long local_88;
  data_ptr_t local_80;
  TemplatedValidityMask<unsigned_long> *local_78;
  Vector *local_70;
  string_t *local_68;
  ulong local_60;
  Vector *local_58;
  string local_50;
  
  FlatVector::VerifyFlatVector(result);
  local_78 = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
  local_80 = result->data;
  pLVar4 = segment + 1;
  local_88 = (long)&segment[1].count + (ulong)segment->capacity;
  lVar3 = *(long *)((long)&segment[1].next + (ulong)segment->capacity * 9);
  uVar7 = 0;
  uVar6 = 0;
  len = extraout_RDX;
  local_a0 = pLVar4;
  local_98 = segment;
  local_90 = total_count;
  local_70 = result;
  while( true ) {
    pdVar2 = local_80;
    if (segment->count <= uVar7) {
      return;
    }
    iVar1 = *total_count;
    if (*(char *)((long)&pLVar4->count + uVar7) != '\x01') break;
    TemplatedValidityMask<unsigned_long>::SetInvalid(local_78,iVar1 + uVar7);
    len = extraout_RDX_00;
LAB_012accf6:
    uVar7 = uVar7 + 1;
  }
  local_68 = (string_t *)(local_80 + uVar7 * 0x10 + iVar1 * 0x10);
  local_58 = *(Vector **)(local_88 + uVar7 * 8);
  local_60 = uVar7;
  aVar9 = (anon_struct_16_3_d7536bce_for_pointer)
          StringVector::EmptyString((StringVector *)local_70,local_58,len);
  ((anon_union_16_2_67f50693_for_value *)(pdVar2 + uVar7 * 0x10 + iVar1 * 0x10))->pointer = aVar9;
  pcVar5 = aVar9.ptr;
  if (aVar9.length < 0xd) {
    pcVar5 = (((anon_union_16_2_67f50693_for_value *)(pdVar2 + uVar7 * 0x10 + iVar1 * 0x10))->
             pointer).prefix;
  }
  pVVar8 = (Vector *)0x0;
  do {
    do {
      uVar7 = (long)local_58 - (long)pVVar8;
      if (local_58 < pVVar8 || uVar7 == 0) {
        string_t::Finalize(local_68);
        len = extraout_RDX_01;
        pLVar4 = local_a0;
        segment = local_98;
        uVar7 = local_60;
        total_count = local_90;
        goto LAB_012accf6;
      }
      if (lVar3 == 0) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Insufficient data to read string",&local_a1);
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __n = *(ushort *)(lVar3 + 2) - uVar6;
      if (uVar7 < __n) {
        __n = uVar7;
      }
      switchD_01939fa4::default(pcVar5 + (long)pVVar8,(void *)(lVar3 + 0x10 + uVar6),__n);
      pVVar8 = (Vector *)(&pVVar8->vector_type + __n);
      uVar6 = uVar6 + __n;
    } while (uVar6 < *(ushort *)(lVar3 + 2));
    lVar3 = *(long *)(lVar3 + 8);
    uVar6 = 0;
  } while( true );
}

Assistant:

static void ReadDataFromVarcharSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                       idx_t &total_count) {
	auto &aggr_vector_validity = FlatVector::Validity(result);

	// use length and (reconstructed) offset to get the correct substrings
	auto aggr_vector_data = FlatVector::GetData<string_t>(result);
	auto str_length_data = GetListLengthData(segment);

	auto null_mask = GetNullMask(segment);
	auto linked_child_list = Load<LinkedList>(const_data_ptr_cast(GetListChildData(segment)));
	auto current_segment = linked_child_list.first_segment;
	idx_t child_offset = 0;
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			// set to null
			aggr_vector_validity.SetInvalid(total_count + i);
			continue;
		}
		// read the string
		auto &result_str = aggr_vector_data[total_count + i];
		auto str_length = Load<uint64_t>(const_data_ptr_cast(str_length_data + i));
		// allocate an empty string for the given size
		result_str = StringVector::EmptyString(result, str_length);
		auto result_data = result_str.GetDataWriteable();
		// copy over the data
		idx_t current_offset = 0;
		while (current_offset < str_length) {
			if (!current_segment) {
				throw InternalException("Insufficient data to read string");
			}
			auto child_data = GetStringData(current_segment);
			idx_t max_copy = MinValue<idx_t>(str_length - current_offset, current_segment->capacity - child_offset);
			memcpy(result_data + current_offset, child_data + child_offset, max_copy);
			current_offset += max_copy;
			child_offset += max_copy;
			if (child_offset >= current_segment->capacity) {
				D_ASSERT(child_offset == current_segment->capacity);
				current_segment = current_segment->next;
				child_offset = 0;
			}
		}

		// finalize the str
		result_str.Finalize();
	}
}